

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_mamba::llm_build_mamba
          (llm_build_mamba *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  pointer plVar3;
  ggml_tensor *this_00;
  undefined8 in_RCX;
  long in_RSI;
  long in_RDI;
  ggml_tensor *in_stack_00000028;
  llm_graph_context *in_stack_00000030;
  ggml_tensor *inp_out_ids;
  int il;
  ggml_tensor *state_mask;
  ggml_tensor *state_copy;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  llama_ubatch *in_stack_000001e8;
  ggml_tensor *in_stack_000001f0;
  ggml_tensor *in_stack_000001f8;
  ggml_tensor *in_stack_00000200;
  ggml_cgraph *in_stack_00000208;
  llm_build_mamba *in_stack_00000210;
  int in_stack_00000220;
  int iVar4;
  int in_stack_ffffffffffffff1c;
  llm_graph_context *in_stack_ffffffffffffff20;
  ggml_tensor *in_stack_ffffffffffffff28;
  ggml_tensor *in_stack_ffffffffffffff30;
  ggml_tensor *in_stack_ffffffffffffff38;
  ggml_tensor *in_stack_ffffffffffffff40;
  ggml_tensor *in_stack_ffffffffffffff70;
  ggml_tensor *in_stack_ffffffffffffff78;
  llm_graph_context *in_stack_ffffffffffffff80;
  int local_54;
  ggml_tensor *local_30;
  ggml_tensor *local_28;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_ffffffffffffff30,
             (llm_graph_params *)in_stack_ffffffffffffff28);
  *(long *)(in_RDI + 0x108) = in_RSI;
  local_30 = llm_graph_context::build_inp_embd(in_stack_00000030,in_stack_00000028);
  llm_graph_context::build_inp_s_copy(in_stack_ffffffffffffff80);
  pgVar1 = llm_graph_context::build_inp_s_mask(in_stack_ffffffffffffff80);
  for (local_54 = 0; (long)local_54 < *(long *)(in_RDI + 0x28); local_54 = local_54 + 1) {
    in_stack_ffffffffffffff70 = local_30;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_54
              );
    in_stack_ffffffffffffff78 =
         llm_graph_context::build_norm
                   ((llm_graph_context *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                    in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                    (llm_norm_type)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                    (int)in_stack_ffffffffffffff20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    iVar4 = local_54;
    local_28 = build_mamba_layer(in_stack_00000210,in_stack_00000208,in_stack_00000200,
                                 in_stack_000001f8,in_stack_000001f0,in_stack_000001e8,
                                 in_stack_00000220);
    if ((long)local_54 == *(long *)(in_RDI + 0x28) + -1) {
      pgVar2 = llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_ffffffffffffff70);
      local_28 = (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_28,pgVar2);
      local_30 = (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_30,pgVar2);
    }
    ggml_add(*(undefined8 *)(in_RDI + 0xc0),local_28,local_30);
    local_30 = llm_graph_context::build_cvec
                         (in_stack_ffffffffffffff20,
                          (ggml_tensor *)CONCAT44(in_stack_ffffffffffffff1c,iVar4),0);
    in_stack_ffffffffffffff40 = local_30;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  }
  pgVar2 = llm_graph_context::build_norm
                     ((llm_graph_context *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                      in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                      (llm_norm_type)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                      (int)in_stack_ffffffffffffff20);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  plVar3 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                     ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                      0x4df47c);
  plVar3->t_embd = pgVar2;
  this_00 = llm_graph_context::build_lora_mm
                      ((llm_graph_context *)pgVar1,in_stack_ffffffffffffff78,
                       in_stack_ffffffffffffff70);
  llm_graph_context::cb
            ((llm_graph_context *)this_00,pgVar2,(char *)in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff1c);
  pgVar1 = this_00;
  plVar3 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                     ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                      0x4df4f8);
  plVar3->t_logits = pgVar1;
  ggml_build_forward_expand(in_RCX,this_00);
  return;
}

Assistant:

llm_build_mamba(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params), model(model) {
        ggml_tensor * cur;
        ggml_tensor * inpL;

        // {n_embd, n_tokens}
        inpL = build_inp_embd(model.tok_embd);

        ggml_tensor * state_copy = build_inp_s_copy();
        ggml_tensor * state_mask = build_inp_s_mask();

        for (int il = 0; il < n_layer; ++il) {
            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            //cur = build_mamba_layer(gf, cur, state_copy, state_mask, il);
            cur = build_mamba_layer(gf, cur, state_copy, state_mask, ubatch, il);

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur  = ggml_get_rows(ctx0,  cur, inp_out_ids);
                inpL = ggml_get_rows(ctx0, inpL, inp_out_ids);
            }

            // residual
            cur = ggml_add(ctx0, cur, inpL);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        // final rmsnorm
        cur = build_norm(inpL,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }